

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

void MRIStepCoupling_Free(MRIStepCoupling MRIC)

{
  int *in_RDI;
  int i;
  int k;
  int local_10;
  int local_c;
  
  if (in_RDI != (int *)0x0) {
    if (*(long *)(in_RDI + 4) != 0) {
      free(*(void **)(in_RDI + 4));
    }
    if (*(long *)(in_RDI + 6) != 0) {
      for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
        if (*(long *)(*(long *)(in_RDI + 6) + (long)local_c * 8) != 0) {
          for (local_10 = 0; local_10 < in_RDI[1]; local_10 = local_10 + 1) {
            if (*(long *)(*(long *)(*(long *)(in_RDI + 6) + (long)local_c * 8) + (long)local_10 * 8)
                != 0) {
              free(*(void **)(*(long *)(*(long *)(in_RDI + 6) + (long)local_c * 8) +
                             (long)local_10 * 8));
              *(undefined8 *)
               (*(long *)(*(long *)(in_RDI + 6) + (long)local_c * 8) + (long)local_10 * 8) = 0;
            }
          }
          free(*(void **)(*(long *)(in_RDI + 6) + (long)local_c * 8));
          *(undefined8 *)(*(long *)(in_RDI + 6) + (long)local_c * 8) = 0;
        }
      }
      free(*(void **)(in_RDI + 6));
    }
    if (*(long *)(in_RDI + 8) != 0) {
      for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
        if (*(long *)(*(long *)(in_RDI + 8) + (long)local_c * 8) != 0) {
          for (local_10 = 0; local_10 < in_RDI[1]; local_10 = local_10 + 1) {
            if (*(long *)(*(long *)(*(long *)(in_RDI + 8) + (long)local_c * 8) + (long)local_10 * 8)
                != 0) {
              free(*(void **)(*(long *)(*(long *)(in_RDI + 8) + (long)local_c * 8) +
                             (long)local_10 * 8));
              *(undefined8 *)
               (*(long *)(*(long *)(in_RDI + 8) + (long)local_c * 8) + (long)local_10 * 8) = 0;
            }
          }
          free(*(void **)(*(long *)(in_RDI + 8) + (long)local_c * 8));
          *(undefined8 *)(*(long *)(in_RDI + 8) + (long)local_c * 8) = 0;
        }
      }
      free(*(void **)(in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void MRIStepCoupling_Free(MRIStepCoupling MRIC)
{
  int k, i;

  /* Free each field within MRIStepCoupling structure, and then
     free structure itself */
  if (MRIC) {

    if (MRIC->c)
      free(MRIC->c);

    if (MRIC->W) {
      for (k=0; k<MRIC->nmat; k++)
        if (MRIC->W[k]) {
          for (i=0; i<MRIC->stages; i++)
            if (MRIC->W[k][i]) {
              free(MRIC->W[k][i]);
              MRIC->W[k][i] = NULL;
            }
          free(MRIC->W[k]);
          MRIC->W[k] = NULL;
        }
      free(MRIC->W);
    }

    if (MRIC->G) {
      for (k=0; k<MRIC->nmat; k++)
        if (MRIC->G[k]) {
          for (i=0; i<MRIC->stages; i++)
            if (MRIC->G[k][i]) {
              free(MRIC->G[k][i]);
              MRIC->G[k][i] = NULL;
            }
          free(MRIC->G[k]);
          MRIC->G[k] = NULL;
        }
      free(MRIC->G);
    }

    free(MRIC);
  }
}